

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_count(void *pIn,void *pMatch)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  void *in_RSI;
  void *in_RDI;
  size_t diff;
  char *pStart;
  size_t in_stack_ffffffffffffffc8;
  void *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    sVar2 = MEM_readST(local_10);
    sVar3 = MEM_readST(local_8);
    if (sVar2 != sVar3) break;
    local_8 = (void *)((long)local_8 + 8);
    local_10 = (void *)((long)local_10 + 8);
  }
  uVar1 = ZSTD_NbCommonBytes(in_stack_ffffffffffffffc8);
  return (long)local_8 + ((ulong)uVar1 - (long)in_RDI);
}

Assistant:

static size_t ZDICT_count(const void* pIn, const void* pMatch)
{
    const char* const pStart = (const char*)pIn;
    for (;;) {
        size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
        if (!diff) {
            pIn = (const char*)pIn+sizeof(size_t);
            pMatch = (const char*)pMatch+sizeof(size_t);
            continue;
        }
        pIn = (const char*)pIn+ZSTD_NbCommonBytes(diff);
        return (size_t)((const char*)pIn - pStart);
    }
}